

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O2

Error llvm::createStringError<unsigned_long,unsigned_char>
                (error_code EC,char *Fmt,unsigned_long *Vals,uchar *Vals_1)

{
  string *Args_1;
  undefined1 *in_R9;
  format_object_base local_90;
  undefined1 local_80;
  undefined8 local_78;
  undefined1 local_70 [8];
  raw_string_ostream Stream;
  string Buffer;
  error_code EC_local;
  
  Stream.OS = (string *)&Buffer._M_string_length;
  Buffer._M_dataplus._M_p = (pointer)0x0;
  Buffer.field_2._8_4_ = EC._M_cat._0_4_;
  Buffer._M_string_length._0_1_ = 0;
  Stream.super_raw_ostream.OutBufCur._0_4_ = 1;
  Stream.super_raw_ostream.OutBufEnd = (char *)0x0;
  Stream.super_raw_ostream._vptr_raw_ostream = (_func_int **)0x0;
  Stream.super_raw_ostream.OutBufStart = (char *)0x0;
  local_70 = (undefined1  [8])&PTR__raw_string_ostream_01129208;
  Stream.super_raw_ostream._32_8_ = &Stream.OS;
  local_90._vptr_format_object_base = (_func_int **)&PTR_home_011280c0;
  local_80 = *in_R9;
  local_78 = *(undefined8 *)Vals_1;
  local_90.Fmt = (char *)Vals;
  raw_ostream::operator<<((raw_ostream *)local_70,&local_90);
  Args_1 = raw_string_ostream::str_abi_cxx11_((raw_string_ostream *)local_70);
  make_error<llvm::StringError,std::__cxx11::string&,std::error_code&>
            (EC._0_8_,(error_code *)Args_1);
  raw_string_ostream::~raw_string_ostream((raw_string_ostream *)local_70);
  std::__cxx11::string::~string((string *)&Stream.OS);
  return (Error)(ErrorInfoBase *)EC._0_8_;
}

Assistant:

inline Error createStringError(std::error_code EC, char const *Fmt,
                               const Ts &... Vals) {
  std::string Buffer;
  raw_string_ostream Stream(Buffer);
  Stream << format(Fmt, Vals...);
  return make_error<StringError>(Stream.str(), EC);
}